

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicseffect.cpp
# Opt level: O1

void __thiscall QGraphicsColorizeEffect::draw(QGraphicsColorizeEffect *this,QPainter *painter)

{
  long lVar1;
  double dVar2;
  char cVar3;
  undefined8 *puVar4;
  long lVar5;
  undefined8 *puVar6;
  QPixmap *this_00;
  QGraphicsEffectPrivate *d;
  long in_FS_OFFSET;
  byte bVar7;
  QPoint offset;
  QTransform restoreTransform;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 *local_d8;
  undefined8 local_d0;
  undefined1 local_c8 [8];
  undefined1 *puStack_c0;
  undefined1 *local_b8;
  undefined8 uStack_b0;
  ushort local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  long local_28;
  
  bVar7 = 0;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QGraphicsEffect).field_0x8;
  if ((*(byte *)(lVar1 + 0xb0) & 1) == 0) {
    if (*(QGraphicsEffectSource **)(lVar1 + 0x78) != (QGraphicsEffectSource *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        QGraphicsEffectSource::draw(*(QGraphicsEffectSource **)(lVar1 + 0x78),painter);
        return;
      }
      goto LAB_00398e78;
    }
  }
  else {
    local_d0 = 0;
    if (*(long *)(lVar1 + 0x78) == 0) {
LAB_00398d6b:
      local_d8 = &DAT_aaaaaaaaaaaaaaaa;
      local_e8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_e8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QGraphicsEffect::sourcePixmap
                ((QGraphicsEffect *)local_e8,(CoordinateSystem)this,(QPoint *)0x0,
                 (PixmapPadMode)&local_d0);
      cVar3 = QPixmap::isNull();
      if (cVar3 == '\0') {
        puVar4 = &DAT_006dc5a0;
        puVar6 = &local_78;
        for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
          *puVar6 = *puVar4;
          puVar4 = puVar4 + (ulong)bVar7 * -2 + 1;
          puVar6 = puVar6 + (ulong)bVar7 * -2 + 1;
        }
        puVar4 = (undefined8 *)QPainter::worldTransform();
        puVar6 = &local_78;
        for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
          *puVar6 = *puVar4;
          puVar4 = puVar4 + (ulong)bVar7 * -2 + 1;
          puVar6 = puVar6 + (ulong)bVar7 * -2 + 1;
        }
        puVar4 = &DAT_006dd1b8;
        puVar6 = (undefined8 *)local_c8;
        for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
          *puVar6 = *puVar4;
          puVar4 = puVar4 + (ulong)bVar7 * -2 + 1;
          puVar6 = puVar6 + (ulong)bVar7 * -2 + 1;
        }
        local_80 = local_80 & 0xfc00;
        QPainter::setWorldTransform((QTransform *)painter,SUB81(local_c8,0));
        dVar2 = (double)(int)((ulong)local_d0 >> 0x20);
        local_f8._8_4_ = SUB84(dVar2,0);
        local_f8._0_8_ = (double)(int)local_d0;
        local_f8._12_4_ = (int)((ulong)dVar2 >> 0x20);
        local_b8 = (undefined1 *)0x0;
        uStack_b0 = 0;
        local_c8 = (undefined1  [8])0x0;
        puStack_c0 = (undefined1 *)0x0;
        (**(code **)(**(long **)(lVar1 + 0xa8) + 0x68))
                  (*(long **)(lVar1 + 0xa8),painter,local_f8,local_e8,local_c8);
        QPainter::setWorldTransform((QTransform *)painter,SUB81(&local_78,0));
      }
      this_00 = (QPixmap *)local_e8;
    }
    else {
      cVar3 = (**(code **)(**(long **)(*(long *)(lVar1 + 0x78) + 8) + 0x60))();
      if (cVar3 == '\0') goto LAB_00398d6b;
      local_b8 = &DAT_aaaaaaaaaaaaaaaa;
      local_c8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      puStack_c0 = &DAT_aaaaaaaaaaaaaaaa;
      QGraphicsEffect::sourcePixmap
                ((QGraphicsEffect *)local_c8,(CoordinateSystem)this,(QPoint *)0x1,
                 (PixmapPadMode)&local_d0);
      cVar3 = QPixmap::isNull();
      if (cVar3 == '\0') {
        dVar2 = (double)(int)((ulong)local_d0 >> 0x20);
        local_e8._8_4_ = SUB84(dVar2,0);
        local_e8._0_8_ = (double)(int)local_d0;
        local_e8._12_4_ = (int)((ulong)dVar2 >> 0x20);
        local_68 = 0;
        uStack_60 = 0;
        local_78 = 0;
        uStack_70 = 0;
        (**(code **)(**(long **)(lVar1 + 0xa8) + 0x68))
                  (*(long **)(lVar1 + 0xa8),painter,local_e8,local_c8);
      }
      this_00 = (QPixmap *)local_c8;
    }
    QPixmap::~QPixmap(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_00398e78:
  __stack_chk_fail();
}

Assistant:

void QGraphicsColorizeEffect::draw(QPainter *painter)
{
    Q_D(QGraphicsColorizeEffect);

    if (!d->opaque) {
        drawSource(painter);
        return;
    }

    QPoint offset;
    if (sourceIsPixmap()) {
        // No point in drawing in device coordinates (pixmap will be scaled anyways).
        const QPixmap pixmap = sourcePixmap(Qt::LogicalCoordinates, &offset, NoPad);
        if (!pixmap.isNull())
            d->filter->draw(painter, offset, pixmap);

        return;
    }

    // Draw pixmap in deviceCoordinates to avoid pixmap scaling.
    const QPixmap pixmap = sourcePixmap(Qt::DeviceCoordinates, &offset);
    if (pixmap.isNull())
        return;

    QTransform restoreTransform = painter->worldTransform();
    painter->setWorldTransform(QTransform());
    d->filter->draw(painter, offset, pixmap);
    painter->setWorldTransform(restoreTransform);
}